

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_add_raw_output
              (wally_tx *tx,uint64_t satoshi,uchar *script,size_t script_len,uint32_t flags)

{
  uint32_t flags_local;
  size_t script_len_local;
  uchar *script_local;
  uint64_t satoshi_local;
  wally_tx *tx_local;
  
  if (tx == (wally_tx *)0x0) {
    tx_local._4_4_ = -2;
  }
  else {
    tx_local._4_4_ =
         tx_add_elements_raw_output_at
                   (tx,(uint32_t)tx->num_outputs,satoshi,script,script_len,(uchar *)0x0,0,
                    (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,flags,false);
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_add_raw_output(struct wally_tx *tx, uint64_t satoshi,
                            const unsigned char *script, size_t script_len,
                            uint32_t flags)
{
    if (!tx)
        return WALLY_EINVAL;
    return tx_add_elements_raw_output_at(tx, tx->num_outputs, satoshi,
                                         script, script_len,
                                         NULL, 0, NULL, 0, NULL, 0,
                                         NULL, 0, NULL, 0, flags, false);
}